

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<DistanceGraph> * __thiscall
pybind11::class_<DistanceGraph>::
def<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>(DistanceGraph::*)(long,bool)const,pybind11::arg,pybind11::arg_v>
          (class_<DistanceGraph> *this,char *name_,
          offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr *f,arg *extra,
          arg_v *extra_1)

{
  offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr f_00;
  name *extra_00;
  handle local_68;
  cpp_function cf;
  object local_58;
  arg_v *local_50;
  handle local_48;
  is_method local_40;
  PyObject *local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_48.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_58.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_50 = (arg_v *)extra;
  local_40.class_.m_ptr = (handle)(handle)name_;
  local_68.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_68.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_38 = local_68.m_ptr;
  cpp_function::
  cpp_function<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,DistanceGraph,long,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg_v>
            (&cf,f_00,extra_00,&local_40,(sibling *)&local_48,(arg *)&local_38,local_50);
  object::~object((object *)&local_68);
  object::~object(&local_58);
  detail::add_class_method((object *)this,name_,&cf);
  object::~object((object *)&cf);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }